

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockBuilderVisitor.cpp
# Opt level: O0

void __thiscall IRT::BlockBuilderVisitor::BlockBuilderVisitor(BlockBuilderVisitor *this)

{
  BlockBuilderVisitor *this_local;
  
  Visitor::Visitor(&this->super_Visitor);
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__BlockBuilderVisitor_001da4b0;
  Label::Label(&this->current_label_);
  this->current_root_ = (Statement *)0x0;
  this->root_block_ = (Block *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IRT::Block_*>_>_>
  ::map(&this->blocks_);
  return;
}

Assistant:

BlockBuilderVisitor::BlockBuilderVisitor()
    : current_root_(nullptr), root_block_(nullptr) {}